

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMBaseInfo.h
# Opt level: O0

char * ARM_ISB_InstSyncBOptToString(uint val)

{
  char *pcStack_10;
  uint val_local;
  
  switch(val) {
  default:
    pcStack_10 = "#0x0";
    break;
  case 1:
    pcStack_10 = "#0x1";
    break;
  case 2:
    pcStack_10 = "#0x2";
    break;
  case 3:
    pcStack_10 = "#0x3";
    break;
  case 4:
    pcStack_10 = "#0x4";
    break;
  case 5:
    pcStack_10 = "#0x5";
    break;
  case 6:
    pcStack_10 = "#0x6";
    break;
  case 7:
    pcStack_10 = "#0x7";
    break;
  case 8:
    pcStack_10 = "#0x8";
    break;
  case 9:
    pcStack_10 = "#0x9";
    break;
  case 10:
    pcStack_10 = "#0xa";
    break;
  case 0xb:
    pcStack_10 = "#0xb";
    break;
  case 0xc:
    pcStack_10 = "#0xc";
    break;
  case 0xd:
    pcStack_10 = "#0xd";
    break;
  case 0xe:
    pcStack_10 = "#0xe";
    break;
  case 0xf:
    pcStack_10 = "sy";
  }
  return pcStack_10;
}

Assistant:

inline static char *ARM_ISB_InstSyncBOptToString(unsigned val)
{
	switch (val) {
		default: // never reach
		case ARM_ISB_RESERVED_0:  return "#0x0";
		case ARM_ISB_RESERVED_1:  return "#0x1";
		case ARM_ISB_RESERVED_2:  return "#0x2";
		case ARM_ISB_RESERVED_3:  return "#0x3";
		case ARM_ISB_RESERVED_4:  return "#0x4";
		case ARM_ISB_RESERVED_5:  return "#0x5";
		case ARM_ISB_RESERVED_6:  return "#0x6";
		case ARM_ISB_RESERVED_7:  return "#0x7";
		case ARM_ISB_RESERVED_8:  return "#0x8";
		case ARM_ISB_RESERVED_9:  return "#0x9";
		case ARM_ISB_RESERVED_10: return "#0xa";
		case ARM_ISB_RESERVED_11: return "#0xb";
		case ARM_ISB_RESERVED_12: return "#0xc";
		case ARM_ISB_RESERVED_13: return "#0xd";
		case ARM_ISB_RESERVED_14: return "#0xe";
		case ARM_ISB_SY:          return "sy";
	}
}